

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O3

void Rsb_ManPerformResub6Test(void)

{
  Vec_Wrd_t *p;
  word *pwVar1;
  Rsb_Man_t *p_00;
  word uTruth1;
  word uTruth0;
  word local_20;
  word local_18;
  
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pwVar1 = (word *)malloc(800);
  p->pArray = pwVar1;
  Vec_WrdPush(p,0xaaaaaaaaaaaaaaaa);
  Vec_WrdPush(p,0xcccccccccccccccc);
  Vec_WrdPush(p,0xf0f0f0f0f0f0f0f0);
  Vec_WrdPush(p,0xff00ff00ff00ff00);
  Vec_WrdPush(p,0xffff0000ffff0000);
  Vec_WrdPush(p,0xffffffff00000000);
  Vec_WrdPush(p,0x8888888888888888);
  Vec_WrdPush(p,0xf000f000f000f000);
  Vec_WrdPush(p,0xffff000000000000);
  p_00 = Rsb_ManAlloc(6,0x40,4,1);
  Rsb_ManPerformResub6(p_00,6,0xfffff888f888f888,p,&local_18,&local_20,1);
  Rsb_ManFree(p_00);
  if (p->pArray != (word *)0x0) {
    free(p->pArray);
  }
  free(p);
  return;
}

Assistant:

void Rsb_ManPerformResub6Test()
{
    Rsb_Man_t * p;
    Vec_Wrd_t * vDivTruths;
    int RetValue;
    word a = s_Truths6[0];
    word b = s_Truths6[1];
    word c = s_Truths6[2];
    word d = s_Truths6[3];
    word e = s_Truths6[4];
    word f = s_Truths6[5];
    word ab = a & b;
    word cd = c & d;
    word ef = e & f;
    word F = ab | cd | ef;
    word uTruth0, uTruth1;

    vDivTruths = Vec_WrdAlloc( 100 );
    Vec_WrdPush( vDivTruths, a );
    Vec_WrdPush( vDivTruths, b );
    Vec_WrdPush( vDivTruths, c );
    Vec_WrdPush( vDivTruths, d );
    Vec_WrdPush( vDivTruths, e );
    Vec_WrdPush( vDivTruths, f );
    Vec_WrdPush( vDivTruths, ab );
    Vec_WrdPush( vDivTruths, cd );
    Vec_WrdPush( vDivTruths, ef );

    p = Rsb_ManAlloc( 6, 64, 4, 1 );

    RetValue = Rsb_ManPerformResub6( p, 6, F, vDivTruths, &uTruth0, &uTruth1, 1 );

    Rsb_ManFree( p );
    Vec_WrdFree( vDivTruths );
}